

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::RandomFragmentOpTests::init(RandomFragmentOpTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  RandomFragmentOpCase *this_00;
  char *name;
  RandomFragmentOpTests *pRVar1;
  string local_38;
  uint local_14;
  RandomFragmentOpTests *pRStack_10;
  int ndx;
  RandomFragmentOpTests *this_local;
  
  local_14 = 0;
  pRVar1 = this;
  pRStack_10 = this;
  while ((int)local_14 < 100) {
    this_00 = (RandomFragmentOpCase *)operator_new(200);
    context = (this->super_TestCaseGroup).m_context;
    de::toString<int>(&local_38,(int *)&local_14);
    name = (char *)std::__cxx11::string::c_str();
    RandomFragmentOpCase::RandomFragmentOpCase(this_00,context,name,"",local_14 * 10);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_38);
    local_14 = local_14 + 1;
    pRVar1 = (RandomFragmentOpTests *)(ulong)local_14;
  }
  return (int)pRVar1;
}

Assistant:

void RandomFragmentOpTests::init (void)
{
	for (int ndx = 0; ndx < 100; ndx++)
		addChild(new RandomFragmentOpCase(m_context, de::toString(ndx).c_str(), "", (deUint32)(ndx*NUM_ITERATIONS_PER_CASE)));
}